

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O2

char16_t * u16tou16_path(char16_t *source,char16_t *dest)

{
  size_t sVar1;
  
  if ((source != (char16_t *)0x0 && dest != (char16_t *)0x0) &&
     (sVar1 = strlenU16(source), (int)sVar1 < 0x104)) {
    strcpyU16(dest,source);
    return dest;
  }
  g_lastError = OPENJTALKERROR_CHARSET_CONVERTING_ERROR;
  return (char16_t *)0x0;
}

Assistant:

char16_t *u16tou16_path(const char16_t *source, char16_t *dest)
{
	if (dest == NULL || source == NULL)
	{
		g_lastError = OPENJTALKERROR_CHARSET_CONVERTING_ERROR;
		return NULL;
	}
	int size = strlenU16(source);
	if (size >= MAX_PATH)
	{
		g_lastError = OPENJTALKERROR_CHARSET_CONVERTING_ERROR;
		return NULL;
	}
	return strcpyU16(dest, source);
}